

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sqrti.h
# Opt level: O1

uint32_t sqrti_4(uint32_t x)

{
  uint32_t res;
  uint uVar1;
  uint32_t add;
  int iVar2;
  uint uVar3;
  
  add = 0x8000;
  uVar1 = 0;
  iVar2 = 0x10;
  do {
    uVar3 = uVar1 | add;
    if (uVar3 * uVar3 <= x) {
      uVar1 = uVar3;
    }
    add = add >> 1;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return uVar1;
}

Assistant:

uint32_t sqrti_4(uint32_t x)
{
    uint32_t res = 0;
    uint32_t add = 0x8000;
    uint32_t i;
    for (i = 0; i < 16; i++)
    {
        uint32_t temp = res | add;
        uint32_t g2 = temp;
        g2 *= temp;
        if (x >= g2)
        {
            res = temp;
        }
        add >>= 1;
    }
    return res;
}